

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
vkt::shaderexecutor::
GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::createCase(MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
            GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this,CaseContext *ctx)

{
  char *name;
  TestNode *this_00;
  PrecisionCase *pPVar1;
  allocator<char> local_41;
  string local_40;
  
  this_00 = (TestNode *)operator_new(0x70);
  name = (ctx->name)._M_dataplus._M_p;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,ctx->testContext,name,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"scalar",&local_41);
  pPVar1 = createFuncCase<vkt::shaderexecutor::Signature<float,float,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,(this->m_funcs).func);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"vec2",&local_41);
  pPVar1 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                       *)(this->m_funcs).func2);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"vec3",&local_41);
  pPVar1 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                       *)(this->m_funcs).func3);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"vec4",&local_41);
  pPVar1 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     (ctx,&local_40,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                       *)(this->m_funcs).func4);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_40);
  (__return_storage_ptr__->super_UniqueBase<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>).
  m_data.ptr = this_00;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase			(const CaseContext& ctx) const
	{
		TestCaseGroup* group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		group->addChild(createFuncCase(ctx, "scalar", m_funcs.func));
		group->addChild(createFuncCase(ctx, "vec2", m_funcs.func2));
		group->addChild(createFuncCase(ctx, "vec3", m_funcs.func3));
		group->addChild(createFuncCase(ctx, "vec4", m_funcs.func4));
		return MovePtr<TestNode>(group);
	}